

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cMultiBindTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::MultiBind::FunctionalBindVertexBuffersTest::iterate(FunctionalBindVertexBuffersTest *this)

{
  ostringstream *this_00;
  char cVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  TestError *this_01;
  GLuint GVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  GLuint index;
  long lVar9;
  GLint max_buffers;
  GLuint vao;
  vector<int,_std::allocator<int>_> strides;
  vector<long,_std::allocator<long>_> offsets;
  vector<unsigned_int,_std::allocator<unsigned_int>_> buffer_ids;
  vector<unsigned_int,_std::allocator<unsigned_int>_> t_buffer_ids;
  vector<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_> buffer;
  uint local_270;
  undefined4 local_26c;
  vector<int,_std::allocator<int>_> local_268;
  vector<long,_std::allocator<long>_> local_248;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_228;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_208;
  vector<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_> local_1e8;
  Enum<int,_2UL> local_1c8;
  Enum<int,_2UL> local_1b8;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  long lVar4;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  local_270 = 0;
  (**(code **)(lVar4 + 0x868))(0x82da,&local_270);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xca9);
  local_1e8.
  super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8.
  super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.
  super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>::resize
            (&local_1e8,(long)(int)local_270);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&local_228,(long)(int)local_270);
  std::vector<long,_std::allocator<long>_>::resize(&local_248,(long)(int)local_270);
  std::vector<int,_std::allocator<int>_>::resize(&local_268,(long)(int)local_270);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&local_208,(long)(int)local_270);
  if (0 < (int)local_270) {
    lVar9 = 0;
    lVar7 = 0;
    do {
      MultiBind::Buffer::InitData
                ((Buffer *)
                 ((long)&(local_1e8.
                          super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_id + lVar9),
                 (this->super_TestCase).m_context,0x8892,0x88ea,0x10,(GLvoid *)0x0);
      local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar7] =
           *(uint *)((long)&(local_1e8.
                             super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_id + lVar9);
      local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar7] = 4;
      local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar7] = 4;
      local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar7] = 0;
      lVar7 = lVar7 + 1;
      lVar9 = lVar9 + 0x18;
    } while (lVar7 < (int)local_270);
  }
  local_26c = 0;
  (**(code **)(lVar4 + 0x708))(1);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"GenVertexArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xcc5);
  (**(code **)(lVar4 + 0xd8))(local_26c);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"BindVertexArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xcc9);
  (**(code **)(lVar4 + 0xe8))
            (0,local_270,
             local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"BindVertexBuffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xccf);
  uVar8 = (ulong)local_270;
  if (0 < (int)local_270) {
    lVar7 = 0;
    do {
      checkVertexAttribBinding
                ((this->super_TestCase).m_context,(GLuint)lVar7,
                 local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar7]);
      lVar7 = lVar7 + 1;
      uVar8 = (ulong)(int)local_270;
    } while (lVar7 < (long)uVar8);
  }
  GVar5 = (int)(((uint)(uVar8 >> 0x1f) & 1) + (int)uVar8) >> 1;
  (**(code **)(lVar4 + 0xe8))
            (0,GVar5,local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start,
             local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"BindVertexBuffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xcdd);
  if (1 < (int)uVar8) {
    index = 0;
    do {
      checkVertexAttribBinding((this->super_TestCase).m_context,index,0);
      index = index + 1;
    } while (GVar5 != index);
  }
  if ((int)GVar5 < (int)local_270) {
    lVar7 = (long)(int)GVar5;
    do {
      checkVertexAttribBinding
                ((this->super_TestCase).m_context,(GLuint)lVar7,
                 local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar7]);
      lVar7 = lVar7 + 1;
    } while (lVar7 < (int)local_270);
  }
  (**(code **)(lVar4 + 0xe8))
            (GVar5,local_270 - GVar5,0,
             local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"BindVertexBuffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xcee);
  if (0 < (int)local_270) {
    GVar5 = 0;
    do {
      checkVertexAttribBinding((this->super_TestCase).m_context,GVar5,0);
      GVar5 = GVar5 + 1;
    } while ((int)GVar5 < (int)local_270);
  }
  uVar6 = 1;
  while( true ) {
    cVar1 = (**(code **)(lVar4 + 0xc68))(uVar6);
    if (cVar1 != '\x01') break;
    uVar6 = uVar6 + 1;
  }
  *local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = uVar6;
  (**(code **)(lVar4 + 0xe8))
            (0,local_270,
             local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start);
  local_1b8.m_value = (**(code **)(lVar4 + 0x800))();
  if (local_1b8.m_value == 0x502) {
    checkVertexAttribBinding((this->super_TestCase).m_context,0,0);
    uVar8 = (ulong)local_270;
    if (1 < (int)local_270) {
      lVar7 = 1;
      do {
        checkVertexAttribBinding
                  ((this->super_TestCase).m_context,(GLuint)lVar7,
                   local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start[lVar7]);
        lVar7 = lVar7 + 1;
        uVar8 = (ulong)(int)local_270;
      } while (lVar7 < (long)uVar8);
    }
    (**(code **)(lVar4 + 0xe8))
              (0,uVar8,0,
               local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"BindVertexBuffers",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                    ,0xd12);
    (**(code **)(lVar4 + 0x490))(1,&local_26c);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"DeleteVertexArrays",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                    ,0xd1c);
    tcu::TestContext::setTestResult
              (((this->super_TestCase).m_context)->m_testCtx,QP_TEST_RESULT_PASS,"Pass");
    if (local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_208.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_208.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_228.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_228.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::vector<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>::~vector
              (&local_1e8);
    return STOP;
  }
  local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"File: ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
             ,0x7f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", line: ",8);
  std::ostream::operator<<(this_00,0xd08);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,". Got wrong error: ",0x13);
  local_1b8.m_getName = glu::getErrorName;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", expected: ",0xc);
  local_1c8.m_getName = glu::getErrorName;
  local_1c8.m_value = 0x502;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", message: ",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"BindVertexBuffers with invalid id",0x21);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_130);
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Invalid error generated",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
             ,0xd08);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult FunctionalBindVertexBuffersTest::iterate()
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

#if DEBUG_ENBALE_MESSAGE_CALLBACK
	gl.debugMessageCallback(debug_proc, &m_context);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DebugMessageCallback");
#endif /* DEBUG_ENBALE_MESSAGE_CALLBACK */

	static const GLintptr buffer_size = 16;
	static const GLintptr offset	  = 4;
	static const GLsizei  stride	  = 4;

	GLuint invalid_id  = 1; /* Start with 1, as 0 is not valid name */
	GLint  max_buffers = 0;

	/* Get max */
	gl.getIntegerv(GL_MAX_VERTEX_ATTRIB_BINDINGS, &max_buffers);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	/* Storage */
	std::vector<Buffer>   buffer;
	std::vector<GLuint>   buffer_ids;
	std::vector<GLintptr> offsets;
	std::vector<GLsizei>  strides;
	std::vector<GLuint>   t_buffer_ids;

	buffer.resize(max_buffers);
	buffer_ids.resize(max_buffers);
	offsets.resize(max_buffers);
	strides.resize(max_buffers);
	t_buffer_ids.resize(max_buffers);

	/* Prepare buffers */
	for (GLint i = 0; i < max_buffers; ++i)
	{
		buffer[i].InitData(m_context, GL_ARRAY_BUFFER, GL_DYNAMIC_COPY, buffer_size, 0 /* data */);

		buffer_ids[i]   = buffer[i].m_id;
		offsets[i]		= offset;
		strides[i]		= stride;
		t_buffer_ids[i] = 0;
	}

	GLuint vao = 0;
	gl.genVertexArrays(1, &vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenVertexArrays");
	try
	{
		gl.bindVertexArray(vao);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindVertexArrays");

		/* - execute BindVertexBuffers to bind all buffer;
		 * - inspect bindings to verify that proper buffers were set;
		 */
		gl.bindVertexBuffers(0, max_buffers, &buffer_ids[0], &offsets[0], &strides[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindVertexBuffers");

		for (GLint i = 0; i < max_buffers; ++i)
		{
			checkVertexAttribBinding(m_context, i, buffer_ids[i]);
		}

		/* - execute BindVertexBuffers for first half of bindings with <buffers> filled
		 * with zeros, to unbind those buffers;
		 * - inspect bindings to verify that proper buffers were unbound;
		 */
		GLint half_index = max_buffers / 2;

		gl.bindVertexBuffers(0, half_index, &t_buffer_ids[0], &offsets[0], &strides[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindVertexBuffers");

		for (GLint i = 0; i < half_index; ++i)
		{
			checkVertexAttribBinding(m_context, i, 0);
		}

		for (GLint i = half_index; i < max_buffers; ++i)
		{
			checkVertexAttribBinding(m_context, i, buffer_ids[i]);
		}

		/* - execute BindVertexBuffers for second half of bindings with NULL as
		 * <buffers>, to unbind those buffers;
		 * - inspect bindings to verify that proper buffers were unbound;
		 */
		gl.bindVertexBuffers(half_index, max_buffers - half_index, 0, &offsets[0], &strides[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindVertexBuffers");

		for (GLint i = 0; i < max_buffers; ++i)
		{
			checkVertexAttribBinding(m_context, i, 0);
		}

		/* - modify <buffers> so first entry is invalid;
		 * - execute BindVertexBuffers to bind all buffers; It is expected that
		 * INVALID_OPERATION will be generated;
		 * - inspect bindings to verify that proper buffers were set;
		 */

		/* Find invalid id */
		while (1)
		{
			if (GL_TRUE != gl.isBuffer(invalid_id))
			{
				break;
			}

			invalid_id += 1;
		}

		buffer_ids[0] = invalid_id;
		gl.bindVertexBuffers(0, max_buffers, &buffer_ids[0], &offsets[0], &strides[0]);
		CHECK_ERROR(GL_INVALID_OPERATION, "BindVertexBuffers with invalid id");

		checkVertexAttribBinding(m_context, 0, 0);
		for (GLint i = 1; i < max_buffers; ++i)
		{
			checkVertexAttribBinding(m_context, i, buffer_ids[i]);
		}

		/* - unbind all buffers. */
		gl.bindVertexBuffers(0, max_buffers, 0, &offsets[0], &strides[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindVertexBuffers");
	}
	catch (const std::exception&)
	{
		gl.deleteVertexArrays(1, &vao);

		TCU_FAIL("Unexpected error generated");
	}

	gl.deleteVertexArrays(1, &vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DeleteVertexArrays");

	/* Set result */
	m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

	/* Done */
	return tcu::TestNode::STOP;
}